

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::BufferTextureStorageTestCase::execute
          (BufferTextureStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ostringstream *this_00;
  uint uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  GLenum GVar6;
  void *pvVar7;
  int line;
  uint uVar8;
  bool bVar9;
  char *msg;
  uint uVar10;
  ulong uVar11;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  (*this->m_gl->useProgram)(this->m_po);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x51a);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glBindBuffer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x51f);
  bVar9 = true;
  bVar3 = true;
  do {
    bVar2 = 1;
    do {
      uVar10 = this->m_sparse_bo_size_rounded >> 1;
      uVar1 = uVar10;
      if (bVar3) {
        uVar1 = 0;
      }
      if (bVar3) {
        uVar10 = this->m_sparse_bo_size_rounded;
      }
      (*this->m_gl->bindBuffer)(0x8c2a,this->m_sparse_bo);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x533);
      (*this->m_gl->bufferPageCommitmentARB)(0x8c2a,(ulong)uVar1,(ulong)uVar10,'\x01');
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x537);
      if (bVar2 == 0) {
        (*this->m_gl->texBufferRange)
                  (0x8c2a,0x8058,this->m_sparse_bo,0,(ulong)this->m_sparse_bo_size);
        GVar6 = (*this->m_gl->getError)();
        msg = "glTexBufferRange() call failed.";
        line = 0x545;
      }
      else {
        (*this->m_gl->texBuffer)(0x8c2a,0x8058,this->m_sparse_bo);
        GVar6 = (*this->m_gl->getError)();
        msg = "glTexBuffer() call failed.";
        line = 0x53e;
      }
      glu::checkError(GVar6,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,line);
      (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_helper_bo_data_size);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x54c);
      (*this->m_gl->dispatchCompute)(this->m_to_width / this->m_po_local_wg_size,1,1);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glDispatchCompute() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x553);
      (*this->m_gl->memoryBarrier)(0x200);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glMemoryBarrier() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x557);
      pvVar7 = (*this->m_gl->mapBuffer)(0x90d2,35000);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glMapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x55f);
      bVar5 = 1;
      if ((ulong)this->m_to_width != 0) {
        uVar8 = 0;
        uVar11 = 0;
        do {
          if ((uVar8 < uVar10 + uVar1 && uVar1 <= uVar8) &&
             (*(int *)((long)pvVar7 + (ulong)uVar8 * 4) != 1)) {
            local_1b0._0_8_ = this->m_testCtx->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"A texel read from the texture buffer at index [",0x2f);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"] was marked as invalid by the CS invocation.",0x2d);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            bVar5 = 0;
            break;
          }
          uVar11 = uVar11 + 1;
          uVar8 = uVar8 + 4;
        } while (uVar11 < this->m_to_width);
      }
      bVar9 = (bool)(bVar9 & bVar5);
      (*this->m_gl->unmapBuffer)(0x90d2);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x576);
      (*this->m_gl->bufferPageCommitmentARB)(0x8c2a,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x57c);
      (*this->m_gl->bufferSubData)
                (0x90d2,0,(ulong)this->m_ssbo_zero_data_size,this->m_ssbo_zero_data);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x581);
      bVar5 = this->m_is_texture_buffer_range_supported & bVar2;
      bVar2 = 0;
    } while (bVar5 != 0);
    bVar4 = !bVar3;
    bVar3 = false;
    if (bVar4) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool BufferTextureStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	/* Bind the program object */
	m_gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

	/* Set up bindings for the copy ops */
	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

	/* Run the test in two iterations:
	 *
	 * a) All required pages are committed.
	 * b) Only half of the pages are committed. */
	for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
	{

		/* Test glTexBuffer() and glTexBufferRange() separately. */
		for (int n_entry_point = 0; n_entry_point < (m_is_texture_buffer_range_supported ? 2 : 1); ++n_entry_point)
		{
			bool result_local = true;

			/* Set up the sparse buffer's memory backing. */
			const unsigned int tbo_commit_start_offset = (n_iteration == 0) ? 0 : m_sparse_bo_size_rounded / 2;
			const unsigned int tbo_commit_size =
				(n_iteration == 0) ? m_sparse_bo_size_rounded : m_sparse_bo_size_rounded / 2;

			m_gl.bindBuffer(GL_TEXTURE_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

			m_gl.bufferPageCommitmentARB(GL_TEXTURE_BUFFER, tbo_commit_start_offset, tbo_commit_size,
										 GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			/* Set up the buffer texture's backing */
			if (n_entry_point == 0)
			{
				m_gl.texBuffer(GL_TEXTURE_BUFFER, GL_RGBA8, m_sparse_bo);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexBuffer() call failed.");
			}
			else
			{
				m_gl.texBufferRange(GL_TEXTURE_BUFFER, GL_RGBA8, m_sparse_bo, 0, /* offset */
									m_sparse_bo_size);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexBufferRange() call failed.");
			}

			/* Set up the sparse buffer's data storage */
			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
								   0,											 /* writeOffset */
								   m_helper_bo_data_size);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			/* Run the compute program */
			DE_ASSERT((m_to_width % m_po_local_wg_size) == 0);

			m_gl.dispatchCompute(m_to_width / m_po_local_wg_size, 1, /* num_groups_y */
								 1);								 /* num_groups_z */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDispatchCompute() call failed.");

			/* Flush the caches */
			m_gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMemoryBarrier() call failed.");

			/* Map the SSBO into process space, so we can check if the texture buffer's
			 * contents was found valid by the compute shader */
			unsigned int		current_tb_offset = 0;
			const unsigned int* ssbo_data_ptr =
				(const unsigned int*)m_gl.mapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

			for (unsigned int n_texel = 0; n_texel < m_to_width && result_local;
				 ++n_texel, current_tb_offset += 4 /* rgba */)
			{
				/* NOTE: Since the CS uses std140 layout, we need to move by 4 ints for
				 *       each result value */
				if (current_tb_offset >= tbo_commit_start_offset &&
					current_tb_offset < (tbo_commit_start_offset + tbo_commit_size) && ssbo_data_ptr[n_texel * 4] != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A texel read from the texture buffer at index "
																   "["
									   << n_texel << "]"
													 " was marked as invalid by the CS invocation."
									   << tcu::TestLog::EndMessage;

					result_local = false;
				} /* if (ssbo_data_ptr[n_texel] != 1) */
			}	 /* for (all result values) */

			result &= result_local;

			m_gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

			/* Remove the physical backing from the sparse buffer  */
			m_gl.bufferPageCommitmentARB(GL_TEXTURE_BUFFER, 0,				  /* offset */
										 m_sparse_bo_size_rounded, GL_FALSE); /* commit */

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			/* Reset SSBO's contents */
			m_gl.bufferSubData(GL_SHADER_STORAGE_BUFFER, 0, /* offset */
							   m_ssbo_zero_data_size, m_ssbo_zero_data);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");
		} /* for (both entry-points) */
	}	 /* for (both iterations) */

	return result;
}